

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.cpp
# Opt level: O3

void * zmq_timers_new(void)

{
  timers_t *this;
  
  this = (timers_t *)operator_new(0x78,(nothrow_t *)&std::nothrow);
  if (this == (timers_t *)0x0) {
    zmq_timers_new_cold_1();
  }
  else {
    zmq::timers_t::timers_t(this);
  }
  return this;
}

Assistant:

void *zmq_timers_new (void)
{
    zmq::timers_t *timers = new (std::nothrow) zmq::timers_t;
    alloc_assert (timers);
    return timers;
}